

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

div_t __thiscall
OpenMD::RectMatrix<double,_3U,_3U>::div(RectMatrix<double,_3U,_3U> *this,int __numer,int __denom)

{
  div_t dVar1;
  undefined4 in_register_00000034;
  double in_XMM0_Qa;
  uint j;
  uint i;
  RectMatrix<double,_3U,_3U> *m_local;
  double s_local;
  RectMatrix<double,_3U,_3U> *this_local;
  
  i = 0;
  dVar1 = (div_t)this;
  while (i < 3) {
    for (j = 0; j < 3; j = j + 1) {
      this->data_[i][j] =
           *(double *)(CONCAT44(in_register_00000034,__numer) + (ulong)i * 0x18 + (ulong)j * 8) /
           in_XMM0_Qa;
    }
    dVar1.quot = i + 1;
    dVar1.rem = 0;
    i = dVar1.quot;
  }
  return dVar1;
}

Assistant:

inline void div(Real s, const RectMatrix<Real, Row, Col>& m) {
      for (unsigned int i = 0; i < Row; i++)
        for (unsigned int j = 0; j < Col; j++)
          this->data_[i][j] = m.data_[i][j] / s;
    }